

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::IfcCovering(IfcCovering *this)

{
  IfcCovering *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcCovering");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00e46780);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>,
             &PTR_construction_vtable_24__00e468b8);
  *(undefined8 *)this = 0xe46650;
  *(undefined8 *)&this->field_0x180 = 0xe46768;
  *(undefined8 *)&this->field_0x88 = 0xe46678;
  *(undefined8 *)&this->field_0x98 = 0xe466a0;
  *(undefined8 *)&this->field_0xd0 = 0xe466c8;
  *(undefined8 *)&this->field_0x100 = 0xe466f0;
  *(undefined8 *)&this->field_0x138 = 0xe46718;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xe46740;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10);
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}